

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cpp
# Opt level: O0

void __thiscall
Printer_prettyPrintNoSpacesNoNewlines_Test::~Printer_prettyPrintNoSpacesNoNewlines_Test
          (Printer_prettyPrintNoSpacesNoNewlines_Test *this)

{
  Printer_prettyPrintNoSpacesNoNewlines_Test *this_local;
  
  ~Printer_prettyPrintNoSpacesNoNewlines_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Printer, prettyPrintNoSpacesNoNewlines)
{
    auto printer = libcellml::Printer::create();
    auto model = libcellml::Model::create();
    model->setName("model");

    auto component3 = libcellml::Component::create("component");
    model->addComponent(component3);
    const std::string equation3 =
        "<apply><eq/>"
        "<apply><diff/>"
        "<bvar><ci>t</ci></bvar>"
        "<ci>X</ci>"
        "</apply>"
        "<apply><minus/>"
        "<apply><times/>"
        "<ci>alpha_X</ci>"
        "<apply><minus/>"
        "<cn cellml:units=\"dimensionless\">1</cn>"
        "<ci>X</ci>"
        "</apply>"
        "</apply>"
        "<apply><times/>"
        "<ci>beta_X</ci>"
        "<ci>X</ci>"
        "</apply>"
        "</apply>"
        "</apply>";
    component3->setMath(MATH_HEADER);
    component3->appendMath(equation3);
    component3->appendMath(MATH_FOOTER);
    EXPECT_EQ(PRETTY_MODEL_STRING, printer->printModel(model));
}